

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

void __thiscall
QTemporaryFileName::QTemporaryFileName(QTemporaryFileName *this,QString *templateName)

{
  undefined1 *puVar1;
  qsizetype qVar2;
  long lVar3;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QString local_c0;
  NativePath local_a8;
  QString local_88;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->path).d.d = (Data *)0x0;
  (this->path).d.ptr = (char *)0x0;
  (this->path).d.size = 0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators(templateName);
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    lVar3 = 0;
    puVar1 = (undefined1 *)local_88.d.size;
    do {
      if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(&local_88,local_88.d.size,KeepSize);
      }
      if (local_88.d.ptr[(long)(puVar1 + -1)] == L'X') {
        lVar3 = lVar3 + 1;
      }
      else {
        if (5 < lVar3) break;
        if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&local_88,local_88.d.size,KeepSize);
        }
        if (local_88.d.ptr[(long)(puVar1 + -1)] == L'/') break;
        lVar3 = 0;
      }
      puVar1 = puVar1 + -1;
    } while (puVar1 != (undefined1 *)0x0);
    if (5 < lVar3) goto LAB_0025adbf;
  }
  str.m_data = ".XXXXXX";
  str.m_size = 7;
  QString::append(&local_88,str);
LAB_0025adbf:
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QDir::cleanPath(&local_c0,&local_88);
  QFileSystemEntry::QFileSystemEntry(&local_68,&local_c0);
  QFileSystemEntry::nativeFilePath(&local_a8,&local_68);
  if (&(local_68.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
    }
  }
  puVar1 = (undefined1 *)local_a8.d.size;
  if ((undefined1 *)local_a8.d.size == (undefined1 *)0x0) {
    qVar2 = 0;
  }
  else {
    qVar2 = 0;
    do {
      if ((&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(&local_a8,local_a8.d.size,KeepSize);
      }
      if (local_a8.d.ptr[(long)(puVar1 + -1)] == 'X') {
        qVar2 = qVar2 + 1;
      }
      else {
        if (5 < qVar2) goto LAB_0025aec3;
        qVar2 = 0;
      }
      puVar1 = puVar1 + -1;
    } while (puVar1 != (undefined1 *)0x0);
    puVar1 = (undefined1 *)0x0;
  }
LAB_0025aec3:
  QByteArray::operator=(&this->path,&local_a8);
  this->pos = (qsizetype)puVar1;
  this->length = qVar2;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTemporaryFileName::QTemporaryFileName(const QString &templateName)
{
    // Ensure there is a placeholder mask
    QString qfilename = QDir::fromNativeSeparators(templateName);
    qsizetype phPos = qfilename.size();
    qsizetype phLength = 0;

    while (phPos != 0) {
        --phPos;

        if (qfilename[phPos] == u'X') {
            ++phLength;
            continue;
        }

        if (phLength >= 6
                || qfilename[phPos] == u'/') {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    if (phLength < 6)
        qfilename.append(".XXXXXX"_L1);

    // "Nativify" :-)
    QFileSystemEntry::NativePath filename =
            QFileSystemEntry(QDir::cleanPath(qfilename)).nativeFilePath();

    // Find mask in native path
    phPos = filename.size();
    phLength = 0;
    while (phPos != 0) {
        --phPos;

        if (filename[phPos] == Latin1Char('X')) {
            ++phLength;
            continue;
        }

        if (phLength >= 6) {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    Q_ASSERT(phLength >= 6);
    path = filename;
    pos = phPos;
    length = phLength;
}